

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

Code * __thiscall md::Code::andi(Code *this,ImmediateValue *value,Param *target,Size size)

{
  void *pvVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  uchar local_49;
  uchar local_48;
  undefined7 uStack_47;
  uchar *local_40;
  long local_38;
  
  iVar5 = 0x240;
  if (size != WORD) {
    iVar5 = (size == LONG | 4) << 7;
  }
  iVar3 = (*target->_vptr_Param[1])(target);
  iVar4 = (**target->_vptr_Param)(target);
  iVar4 = iVar5 + iVar3 * 8 + iVar4;
  local_48 = (uchar)((uint)iVar4 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_48);
  local_48 = (uchar)iVar4;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_48);
  (*(value->super_Param)._vptr_Param[2])(&local_48,value);
  puVar2 = local_40;
  puVar6 = (uchar *)CONCAT71(uStack_47,local_48);
  if (puVar6 != local_40) {
    do {
      local_49 = *puVar6;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_49);
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  pvVar1 = (void *)CONCAT71(uStack_47,local_48);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_38 - (long)pvVar1);
  }
  (*target->_vptr_Param[2])(&local_48,target);
  puVar6 = (uchar *)CONCAT71(uStack_47,local_48);
  if (puVar6 != local_40) {
    do {
      local_49 = *puVar6;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_49);
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_40);
  }
  pvVar1 = (void *)CONCAT71(uStack_47,local_48);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_38 - (long)pvVar1);
  }
  return this;
}

Assistant:

Code& Code::andi(const ImmediateValue& value, const Param& target, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x0200 + (size_code << 6) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(value.getAdditionnalData());
    this->add_bytes(target.getAdditionnalData());

    return *this;
}